

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O2

Index __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
           *this,ID_index cellIndex,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  Index IVar1;
  undefined8 in_RAX;
  ulong uVar2;
  undefined8 uStack_38;
  
  if (dim == -1) {
    uVar2 = (long)(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar2 == 0) {
      dim = 0;
    }
    else {
      dim = (int)(uVar2 >> 2) + -1;
    }
  }
  uStack_38 = in_RAX;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::_orderRowsIfNecessary
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
              *)this);
  uVar2 = (ulong)(*(long *)(this + 8) - *(long *)this) >> 2;
  while (uStack_38 = CONCAT44((uint)uVar2,(undefined4)uStack_38), (uint)uVar2 <= cellIndex) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
               (value_type_conflict1 *)((long)&uStack_38 + 4));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x18),
               (value_type_conflict1 *)((long)&uStack_38 + 4));
    uVar2 = (ulong)(uStack_38._4_4_ + 1);
  }
  _container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (this,boundary,*(Index *)(this + 0x50),dim);
  IVar1 = *(Index *)(this + 0x50);
  *(Index *)(this + 0x50) = IVar1 + 1;
  return IVar1;
}

Assistant:

inline typename Boundary_matrix<Master_matrix>::Index Boundary_matrix<Master_matrix>::insert_boundary(
    ID_index cellIndex, const Boundary_range& boundary, Dimension dim)
{
  if (dim == Master_matrix::template get_null_value<Dimension>()) dim = boundary.size() == 0 ? 0 : boundary.size() - 1;

  _orderRowsIfNecessary();

  //updates container sizes
  if constexpr (Master_matrix::Option_list::has_row_access && !Master_matrix::Option_list::has_removable_rows) {
    if (boundary.size() != 0){
      ID_index pivot;
      if constexpr (Master_matrix::Option_list::is_z2) {
        pivot = *std::prev(boundary.end());
      } else {
        pivot = std::prev(boundary.end())->first;
      }
      //row container
      if (RA_opt::rows_->size() <= pivot) RA_opt::rows_->resize(pivot + 1);
    }
  }

  //row swap map containers
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (activeSwapOption) {
      Swap_opt::indexToRow_.emplace(cellIndex, cellIndex);
      Swap_opt::rowToIndex_.emplace(cellIndex, cellIndex);
    }
  } else {
    if constexpr (activeSwapOption) {
      for (Index i = Swap_opt::indexToRow_.size(); i <= cellIndex; ++i) {
        Swap_opt::indexToRow_.push_back(i);
        Swap_opt::rowToIndex_.push_back(i);
      }
    }
  }

  //maps for possible shifting between column content and position indices used for birth events
  if constexpr (activePairingOption){
    if (cellIndex != nextInsertIndex_){
      Pair_opt::idToPosition_.emplace(cellIndex, nextInsertIndex_);
      if constexpr (Master_matrix::Option_list::has_removable_columns){
        Pair_opt::PIDM::map_.emplace(nextInsertIndex_, cellIndex);
      }
    }
  }

  _container_insert(boundary, nextInsertIndex_, dim);

  return nextInsertIndex_++;
}